

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O3

void helics::processTimerCallback
               (shared_ptr<helics::MessageTimer> *mtimer,int32_t index,error_code *ec)

{
  error_code local_30;
  
  std::error_code::error_code<asio::error::basic_errors,void>(&local_30,operation_aborted);
  if ((ec->_M_cat != local_30._M_cat) || (ec->_M_value != local_30._M_value)) {
    MessageTimer::sendMessage
              ((mtimer->super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               ,index);
  }
  return;
}

Assistant:

static void processTimerCallback(const std::shared_ptr<MessageTimer>& mtimer,
                                 int32_t index,
                                 const std::error_code& ec)
{
    if (ec != asio::error::operation_aborted) {
        try {
            mtimer->sendMessage(index);
        }
        catch (std::exception& e) {
            std::cerr << "exception caught from sendMessage:" << e.what() << std::endl;
        }
    }
}